

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O2

int fdmustach(char *template,mustach_itf *itf,void *closure,int fd)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fdopen(fd,"w");
  if (__stream == (FILE *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001051b9;
    piVar3 = __errno_location();
    *piVar3 = 0xc;
    iVar2 = -1;
  }
  else {
    iVar2 = fmustach(template,itf,closure,(FILE *)__stream);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_001051b9:
      __stack_chk_fail();
    }
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

int fdmustach(const char *template, struct mustach_itf *itf, void *closure, int fd)
{
	int rc;
	FILE *file;

	file = fdopen(fd, "w");
	if (file == NULL) {
		rc = MUSTACH_ERROR_SYSTEM;
		errno = ENOMEM;
	} else {
		rc = fmustach(template, itf, closure, file);
		fclose(file);
	}
	return rc;
}